

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

void __thiscall Sintatico::constante(Sintatico *this)

{
  bool bVar1;
  int token_consumir;
  
  bVar1 = Tokens::isEqual((Tokens *)this,this->tok,2);
  if (bVar1) {
    identificador(this);
    return;
  }
  token_consumir = 7;
  bVar1 = Tokens::isEqual((Tokens *)this,this->tok,7);
  if (!bVar1) {
    token_consumir = 8;
    bVar1 = Tokens::isEqual((Tokens *)this,this->tok,8);
    if (!bVar1) goto LAB_0010318e;
  }
  eat(this,token_consumir);
LAB_0010318e:
  numero(this);
  return;
}

Assistant:

void Sintatico::constante() {
  if (isEqual(tok, LETRA)) identificador();
  else {
    if (isEqual(tok, MAIS)) eat(MAIS);
    else if (isEqual(tok, MENOS)) eat(MENOS);
    numero();
  }
}